

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::StencilTexturingTests::init(StencilTexturingTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  TestNode *pTVar3;
  char *pcVar4;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"format",
             "Formats");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pcVar4 = glu::getTextureFormatName(0x8cad);
  tcu::TestCase::TestCase((TestCase *)pTVar3,pCVar1->m_testCtx,"depth32f_stencil8_2d",pcVar4);
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021ab7b0;
  *(undefined4 *)&pTVar3[1].m_testCtx = 0x8cad;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pcVar4 = glu::getTextureFormatName(0x8cad);
  tcu::TestCase::TestCase((TestCase *)pTVar3,pCVar1->m_testCtx,"depth32f_stencil8_2d_array",pcVar4);
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021ab800;
  *(undefined4 *)&pTVar3[1].m_testCtx = 0x8cad;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pcVar4 = glu::getTextureFormatName(0x8cad);
  tcu::TestCase::TestCase((TestCase *)pTVar3,pCVar1->m_testCtx,"depth32f_stencil8_cube",pcVar4);
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021ab850;
  *(undefined4 *)&pTVar3[1].m_testCtx = 0x8cad;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pcVar4 = glu::getTextureFormatName(0x88f0);
  tcu::TestCase::TestCase((TestCase *)pTVar3,pCVar1->m_testCtx,"depth24_stencil8_2d",pcVar4);
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021ab7b0;
  *(undefined4 *)&pTVar3[1].m_testCtx = 0x88f0;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pcVar4 = glu::getTextureFormatName(0x88f0);
  tcu::TestCase::TestCase((TestCase *)pTVar3,pCVar1->m_testCtx,"depth24_stencil8_2d_array",pcVar4);
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021ab800;
  *(undefined4 *)&pTVar3[1].m_testCtx = 0x88f0;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pcVar4 = glu::getTextureFormatName(0x88f0);
  tcu::TestCase::TestCase((TestCase *)pTVar3,pCVar1->m_testCtx,"depth24_stencil8_cube",pcVar4);
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021ab850;
  *(undefined4 *)&pTVar3[1].m_testCtx = 0x88f0;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pcVar4 = glu::getTextureFormatName(0x8d48);
  tcu::TestCase::TestCase((TestCase *)pTVar3,pCVar1->m_testCtx,"stencil_index8_2d",pcVar4);
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021ab7b0;
  *(undefined4 *)&pTVar3[1].m_testCtx = 0x8d48;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pcVar4 = glu::getTextureFormatName(0x8d48);
  tcu::TestCase::TestCase((TestCase *)pTVar3,pCVar1->m_testCtx,"stencil_index8_2d_array",pcVar4);
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021ab800;
  *(undefined4 *)&pTVar3[1].m_testCtx = 0x8d48;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pcVar4 = glu::getTextureFormatName(0x8d48);
  tcu::TestCase::TestCase((TestCase *)pTVar3,pCVar1->m_testCtx,"stencil_index8_cube",pcVar4);
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021ab850;
  *(undefined4 *)&pTVar3[1].m_testCtx = 0x8d48;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"render",
             "Read rendered stencil values");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pcVar4 = glu::getTextureFormatName(0x8cad);
  tcu::TestCase::TestCase((TestCase *)pTVar3,pCVar1->m_testCtx,"depth32f_stencil8_clear",pcVar4);
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021ab8a0;
  *(undefined4 *)&pTVar3[1].m_testCtx = 0x8cad;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pcVar4 = glu::getTextureFormatName(0x8cad);
  tcu::TestCase::TestCase((TestCase *)pTVar3,pCVar1->m_testCtx,"depth32f_stencil8_draw",pcVar4);
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021ab8f0;
  *(undefined4 *)&pTVar3[1].m_testCtx = 0x8cad;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pcVar4 = glu::getTextureFormatName(0x88f0);
  tcu::TestCase::TestCase((TestCase *)pTVar3,pCVar1->m_testCtx,"depth24_stencil8_clear",pcVar4);
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021ab8a0;
  *(undefined4 *)&pTVar3[1].m_testCtx = 0x88f0;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pcVar4 = glu::getTextureFormatName(0x88f0);
  tcu::TestCase::TestCase((TestCase *)pTVar3,pCVar1->m_testCtx,"depth24_stencil8_draw",pcVar4);
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021ab8f0;
  *(undefined4 *)&pTVar3[1].m_testCtx = 0x88f0;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"misc",
             "Misc cases");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pcVar4 = glu::getTextureFormatName(0x88f0);
  tcu::TestCase::TestCase((TestCase *)pTVar3,pCVar1->m_testCtx,"compare_mode_effect",pcVar4);
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021ab940;
  *(undefined4 *)&pTVar3[1].m_testCtx = 0x88f0;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pcVar4 = glu::getTextureFormatName(0x88f0);
  tcu::TestCase::TestCase((TestCase *)pTVar3,pCVar1->m_testCtx,"base_level",pcVar4);
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021ab990;
  *(undefined4 *)&pTVar3[1].m_testCtx = 0x88f0;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  return extraout_EAX;
}

Assistant:

void StencilTexturingTests::init (void)
{
	// .format
	{
		tcu::TestCaseGroup* const formatGroup = new tcu::TestCaseGroup(m_testCtx, "format", "Formats");
		addChild(formatGroup);

		formatGroup->addChild(new UploadTex2DCase		(m_context, "depth32f_stencil8_2d",			GL_DEPTH32F_STENCIL8));
		formatGroup->addChild(new UploadTex2DArrayCase	(m_context, "depth32f_stencil8_2d_array",	GL_DEPTH32F_STENCIL8));
		formatGroup->addChild(new UploadTexCubeCase		(m_context, "depth32f_stencil8_cube",		GL_DEPTH32F_STENCIL8));
		formatGroup->addChild(new UploadTex2DCase		(m_context, "depth24_stencil8_2d",			GL_DEPTH24_STENCIL8));
		formatGroup->addChild(new UploadTex2DArrayCase	(m_context, "depth24_stencil8_2d_array",	GL_DEPTH24_STENCIL8));
		formatGroup->addChild(new UploadTexCubeCase		(m_context, "depth24_stencil8_cube",		GL_DEPTH24_STENCIL8));

		// OES_texture_stencil8
		formatGroup->addChild(new UploadTex2DCase		(m_context, "stencil_index8_2d",			GL_STENCIL_INDEX8));
		formatGroup->addChild(new UploadTex2DArrayCase	(m_context, "stencil_index8_2d_array",		GL_STENCIL_INDEX8));
		formatGroup->addChild(new UploadTexCubeCase		(m_context, "stencil_index8_cube",			GL_STENCIL_INDEX8));
	}

	// .render
	{
		tcu::TestCaseGroup* const readRenderGroup = new tcu::TestCaseGroup(m_testCtx, "render", "Read rendered stencil values");
		addChild(readRenderGroup);

		readRenderGroup->addChild(new ClearTex2DCase	(m_context, "depth32f_stencil8_clear",	GL_DEPTH32F_STENCIL8));
		readRenderGroup->addChild(new RenderTex2DCase	(m_context, "depth32f_stencil8_draw",	GL_DEPTH32F_STENCIL8));
		readRenderGroup->addChild(new ClearTex2DCase	(m_context, "depth24_stencil8_clear",	GL_DEPTH24_STENCIL8));
		readRenderGroup->addChild(new RenderTex2DCase	(m_context, "depth24_stencil8_draw",	GL_DEPTH24_STENCIL8));
	}

	// .misc
	{
		tcu::TestCaseGroup* const miscGroup = new tcu::TestCaseGroup(m_testCtx, "misc", "Misc cases");
		addChild(miscGroup);

		miscGroup->addChild(new CompareModeCase	(m_context, "compare_mode_effect",	GL_DEPTH24_STENCIL8));
		miscGroup->addChild(new BaseLevelCase	(m_context, "base_level",			GL_DEPTH24_STENCIL8));
	}
}